

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populate
          (CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  bool bVar1;
  logic_error *this_00;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_RCX;
  CommandLine<Catch::ConfigData> *in_RDX;
  vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  *in_RDI;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unusedTokens;
  ConfigData *in_stack_000000f8;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_00000100;
  CommandLine<Catch::ConfigData> *in_stack_00000108;
  vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  *this_01;
  ConfigData *in_stack_ffffffffffffffb8;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_ffffffffffffffc0;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffffc8;
  ConfigData *in_stack_ffffffffffffffd8;
  
  this_01 = in_RDI;
  bVar1 = std::
          vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::empty(in_RDI);
  if ((bVar1) &&
     (bVar1 = std::
              map<int,_Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
              ::empty((map<int,_Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                       *)0x1bc992), bVar1)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No options or arguments specified");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  populateOptions(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  populateFixedArgs(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_01,
             (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)in_RDI);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector
            ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_01);
  populateFloatingArgs
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_01,
             (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)in_RDI);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector
            ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_01);
  return (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_01;
}

Assistant:

std::vector<Parser::Token> populate( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( m_options.empty() && m_positionalArgs.empty() )
                throw std::logic_error( "No options or arguments specified" );

            std::vector<Parser::Token> unusedTokens = populateOptions( tokens, config );
            unusedTokens = populateFixedArgs( unusedTokens, config );
            unusedTokens = populateFloatingArgs( unusedTokens, config );
            return unusedTokens;
        }